

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
::solver_random_inequalities_101coeff
          (solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  uint uVar1;
  int iVar2;
  pointer pmVar3;
  pointer pfVar4;
  byte bVar5;
  bool bVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  rc_data *prVar10;
  bound_factor *pbVar11;
  longdouble *plVar12;
  undefined8 extraout_RAX;
  ulong uVar13;
  solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
  *psVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar19;
  pointer pfVar20;
  int *piVar21;
  void *pvVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  
  this->rng = rng_;
  pvVar19 = csts;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar23 = (ulong)(this->ap).m_rows_values.m_length;
  uVar13 = uVar23 * 4;
  piVar9 = (int *)operator_new__(uVar13);
  memset(piVar9,0,uVar13);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar9;
  pmVar3 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar17 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3;
  uVar13 = (long)*(pointer *)
                  ((long)&(pmVar3->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar3->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  if (lVar17 != 0x28) {
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar30 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar31 = vpbroadcastq_avx512f();
    uVar13 = 0;
    auVar32 = vpbroadcastq_avx512f();
    do {
      auVar33 = vpbroadcastq_avx512f();
      auVar34 = vmovdqa64_avx512f(auVar31);
      vpmullq_avx512dq(auVar27,auVar29);
      uVar13 = uVar13 + 8;
      auVar27 = vpaddq_avx512f(auVar27,auVar30);
      auVar31 = vporq_avx512f(auVar33,auVar28);
      uVar7 = vpcmpuq_avx512f(auVar31,auVar32,2);
      auVar31 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar3->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar19));
      bVar5 = (byte)uVar7;
      auVar33._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar31._8_8_;
      auVar33._0_8_ = (ulong)(bVar5 & 1) * auVar31._0_8_;
      auVar33._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar31._16_8_;
      auVar33._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar31._24_8_;
      auVar33._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar31._32_8_;
      auVar33._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar31._40_8_;
      auVar33._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar31._48_8_;
      auVar33._56_8_ = (uVar7 >> 7) * auVar31._56_8_;
      auVar31 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar19->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar3->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar35._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar31._8_8_;
      auVar35._0_8_ = (ulong)(bVar5 & 1) * auVar31._0_8_;
      auVar35._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar31._16_8_;
      auVar35._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar31._24_8_;
      auVar35._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar31._32_8_;
      auVar35._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar31._40_8_;
      auVar35._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar31._48_8_;
      auVar35._56_8_ = (uVar7 >> 7) * auVar31._56_8_;
      auVar31 = vpsubq_avx512f(auVar33,auVar35);
      auVar31 = vpsraq_avx512f(auVar31,3);
      auVar31 = vpmaxuq_avx512f(auVar34,auVar31);
    } while (((lVar17 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar13);
    auVar27 = vmovdqa64_avx512f(auVar31);
    auVar28._0_8_ = (ulong)(bVar5 & 1) * auVar27._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar34._0_8_;
    bVar6 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar28._8_8_ = (ulong)bVar6 * auVar27._8_8_ | (ulong)!bVar6 * auVar34._8_8_;
    bVar6 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar28._16_8_ = (ulong)bVar6 * auVar27._16_8_ | (ulong)!bVar6 * auVar34._16_8_;
    bVar6 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar28._24_8_ = (ulong)bVar6 * auVar27._24_8_ | (ulong)!bVar6 * auVar34._24_8_;
    bVar6 = (bool)((byte)(uVar7 >> 4) & 1);
    auVar28._32_8_ = (ulong)bVar6 * auVar27._32_8_ | (ulong)!bVar6 * auVar34._32_8_;
    bVar6 = (bool)((byte)(uVar7 >> 5) & 1);
    auVar28._40_8_ = (ulong)bVar6 * auVar27._40_8_ | (ulong)!bVar6 * auVar34._40_8_;
    bVar6 = (bool)((byte)(uVar7 >> 6) & 1);
    auVar28._48_8_ = (ulong)bVar6 * auVar27._48_8_ | (ulong)!bVar6 * auVar34._48_8_;
    auVar28._56_8_ = (uVar7 >> 7) * auVar27._56_8_ | (ulong)!SUB81(uVar7 >> 7,0) * auVar34._56_8_;
    auVar26 = vextracti64x4_avx512f(auVar28,1);
    auVar27 = vpmaxuq_avx512f(auVar28,ZEXT3264(auVar26));
    auVar24 = vpmaxuq_avx512vl(auVar27._0_16_,auVar27._16_16_);
    auVar25 = vpshufd_avx(auVar24,0xee);
    auVar25 = vpmaxuq_avx512vl(auVar24,auVar25);
    uVar13 = auVar25._0_8_;
  }
  uVar13 = -(ulong)(uVar13 >> 0x3b != 0) | uVar13 << 5;
  prVar10 = (rc_data *)operator_new__(uVar13);
  memset(prVar10,0,uVar13);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = (long)m_;
  uVar13 = SUB168(auVar25 * ZEXT816(0xc),0);
  if (SUB168(auVar25 * ZEXT816(0xc),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_false>
  ._M_head_impl = prVar10;
  pbVar11 = (bound_factor *)operator_new__(uVar13);
  memset(pbVar11,0,uVar13);
  uVar13 = (long)m_ << 4;
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor_*,_false>
  ._M_head_impl = pbVar11;
  if (m_ < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  plVar12 = (longdouble *)operator_new__(uVar13);
  memset(plVar12,0,uVar13);
  (this->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar12;
  uVar23 = uVar23 << 4;
  plVar12 = (longdouble *)operator_new__(uVar23);
  pvVar22 = (void *)0x0;
  memset(plVar12,0,uVar23);
  (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar12;
  this->c = c_;
  (this->dist)._M_param._M_p = 0.5;
  this->m = m_;
  this->n = n_;
  pmVar3 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((long)(csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3 >> 3) *
           -0x3333333333333333;
  if ((int)uVar13 != 0) {
    uVar23 = 0;
    psVar14 = this;
    do {
      pfVar20 = *(pointer *)
                 &pmVar3[uVar23].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar4 = *(pointer *)
                ((long)&pmVar3[uVar23].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar20 == pfVar4) {
        iVar18 = 0;
        iVar15 = 0;
      }
      else {
        iVar18 = 0;
        piVar21 = piVar9 + (int)pvVar22;
        iVar15 = 0;
        do {
          uVar1 = pfVar20->factor + 1;
          psVar14 = (solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                     *)(ulong)uVar1;
          if ((uVar1 & 0xfffffffd) != 0) {
            itm::solver_random_inequalities_101coeff();
            goto LAB_001b3ed2;
          }
          *piVar21 = pfVar20->factor;
          piVar8 = &pfVar20->factor;
          uVar1 = (uint)(*piVar8 < 1);
          psVar14 = (solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                     *)(ulong)uVar1;
          pfVar20 = pfVar20 + 1;
          piVar21 = piVar21 + 1;
          pvVar22 = (void *)(ulong)((int)pvVar22 + 1);
          iVar18 = iVar18 + (uint)(0 < *piVar8);
          iVar15 = iVar15 + uVar1;
        } while (pfVar20 != pfVar4);
      }
      iVar2 = pmVar3[uVar23].min;
      if (iVar2 == pmVar3[uVar23].max) {
        pbVar11[uVar23].min = iVar2;
        pbVar11[uVar23].max = iVar2;
      }
      else {
        iVar16 = -iVar15;
        if (iVar2 != iVar16 && SBORROW4(iVar2,iVar16) == iVar2 + iVar15 < 0) {
          iVar16 = iVar2;
        }
        pbVar11[uVar23].min = iVar16;
        if (pmVar3[uVar23].max < iVar18) {
          iVar18 = pmVar3[uVar23].max;
        }
        pbVar11[uVar23].max = iVar18;
        if (iVar18 < iVar16) {
LAB_001b3ed2:
          itm::solver_random_inequalities_101coeff();
          operator_delete__(pvVar22);
          (psVar14->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
          ._M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
          super__Head_base<0UL,_long_double_*,_false>._M_head_impl = (longdouble *)0x0;
          pbVar11 = (psVar14->b)._M_t.
                    super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                    .
                    super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor_*,_false>
                    ._M_head_impl;
          if (pbVar11 != (bound_factor *)0x0) {
            operator_delete__(pbVar11);
          }
          (this->b)._M_t.
          super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor_*,_false>
          ._M_head_impl = (bound_factor *)0x0;
          prVar10 = (this->R)._M_t.
                    super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                    .
                    super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_false>
                    ._M_head_impl;
          if (prVar10 != (rc_data *)0x0) {
            operator_delete__(prVar10);
          }
          (this->R)._M_t.
          super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_false>
          ._M_head_impl = (rc_data *)0x0;
          piVar9 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          if (piVar9 != (int *)0x0) {
            operator_delete__(piVar9);
          }
          (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
          sparse_matrix<int>::~sparse_matrix(&this->ap);
          _Unwind_Resume(extraout_RAX);
        }
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != (uVar13 & 0xffffffff));
  }
  return;
}

Assistant:

solver_random_inequalities_101coeff(
      random_engine& rng_,
      int m_,
      int n_,
      const cost_type& c_,
      const std::vector<merged_constraint>& csts)
      : rng(rng_)
      , ap(csts, m_, n_)
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , P(std::make_unique<Float[]>(ap.size()))
      , c(c_)
      , dist(0.5)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor > 0)
                    upper++;
                else
                    lower++;
            }

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(-lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            bx_ensures(b[i].min <= b[i].max);
        }
    }